

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts3InitTokenizer(Fts3Hash *pHash,char *zArg,sqlite3_tokenizer **ppTok,char **pzErr)

{
  Fts3Hash *pFVar1;
  size_t sVar2;
  void *pvVar3;
  char *pcVar4;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  undefined8 in_RSI;
  void *in_RDI;
  bool bVar5;
  char **aNew;
  int nNew;
  int iArg;
  char **aArg;
  sqlite3_tokenizer_module *m;
  char *zEnd;
  char *zCopy;
  int n;
  char *z;
  int rc;
  void *in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff74;
  int *in_stack_ffffffffffffff80;
  Fts3Hash *zStr;
  int local_64;
  void *local_60;
  Fts3Hash *local_38;
  int local_2c;
  int local_4;
  
  pFVar1 = (Fts3Hash *)sqlite3_mprintf("%s",in_RSI);
  if (pFVar1 == (Fts3Hash *)0x0) {
    local_4 = 7;
  }
  else {
    zStr = pFVar1;
    sVar2 = strlen((char *)pFVar1);
    pcVar4 = &zStr->keyClass;
    local_38 = (Fts3Hash *)sqlite3Fts3NextToken(&zStr->keyClass,in_stack_ffffffffffffff80);
    if (local_38 == (Fts3Hash *)0x0) {
      local_38 = pFVar1;
    }
    local_38->keyClass = '\0';
    sqlite3Fts3Dequote(&local_38->keyClass);
    pFVar1 = local_38;
    strlen(&local_38->keyClass);
    pvVar3 = sqlite3Fts3HashFind(pFVar1,in_RDI,in_stack_ffffffffffffff74);
    if (pvVar3 == (void *)0x0) {
      pcVar4 = sqlite3_mprintf("unknown tokenizer: %s",local_38);
      *in_RCX = pcVar4;
      local_2c = 1;
LAB_001bcf37:
      sqlite3_free((void *)0x1bcf41);
      local_4 = local_2c;
    }
    else {
      local_60 = (void *)0x0;
      local_64 = 0;
      while( true ) {
        local_38 = (Fts3Hash *)&local_38->copyKey;
        bVar5 = false;
        if (local_38 < pcVar4 + sVar2) {
          local_38 = (Fts3Hash *)sqlite3Fts3NextToken(&zStr->keyClass,(int *)pFVar1);
          bVar5 = local_38 != (Fts3Hash *)0x0;
        }
        if (!bVar5) {
          local_2c = (**(code **)((long)pvVar3 + 8))(local_64,local_60,in_RDX);
          if (local_2c == 0) {
            *(void **)*in_RDX = pvVar3;
          }
          else {
            pcVar4 = sqlite3_mprintf("unknown tokenizer");
            *in_RCX = pcVar4;
          }
          sqlite3_free((void *)0x1bcf37);
          goto LAB_001bcf37;
        }
        local_60 = sqlite3_realloc(in_stack_ffffffffffffff68,0);
        if (local_60 == (void *)0x0) break;
        *(Fts3Hash **)((long)local_60 + (long)local_64 * 8) = local_38;
        local_38->keyClass = '\0';
        sqlite3Fts3Dequote(&local_38->keyClass);
        local_64 = local_64 + 1;
      }
      sqlite3_free((void *)0x1bce68);
      sqlite3_free((void *)0x1bce72);
      local_4 = 7;
    }
  }
  return local_4;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3InitTokenizer(
  Fts3Hash *pHash,                /* Tokenizer hash table */
  const char *zArg,               /* Tokenizer name */
  sqlite3_tokenizer **ppTok,      /* OUT: Tokenizer (if applicable) */
  char **pzErr                    /* OUT: Set to malloced error message */
){
  int rc;
  char *z = (char *)zArg;
  int n = 0;
  char *zCopy;
  char *zEnd;                     /* Pointer to nul-term of zCopy */
  sqlite3_tokenizer_module *m;

  zCopy = sqlite3_mprintf("%s", zArg);
  if( !zCopy ) return SQLITE_NOMEM;
  zEnd = &zCopy[strlen(zCopy)];

  z = (char *)sqlite3Fts3NextToken(zCopy, &n);
  if( z==0 ){
    assert( n==0 );
    z = zCopy;
  }
  z[n] = '\0';
  sqlite3Fts3Dequote(z);

  m = (sqlite3_tokenizer_module *)sqlite3Fts3HashFind(pHash,z,(int)strlen(z)+1);
  if( !m ){
    *pzErr = sqlite3_mprintf("unknown tokenizer: %s", z);
    rc = SQLITE_ERROR;
  }else{
    char const **aArg = 0;
    int iArg = 0;
    z = &z[n+1];
    while( z<zEnd && (NULL!=(z = (char *)sqlite3Fts3NextToken(z, &n))) ){
      int nNew = sizeof(char *)*(iArg+1);
      char const **aNew = (const char **)sqlite3_realloc((void *)aArg, nNew);
      if( !aNew ){
        sqlite3_free(zCopy);
        sqlite3_free((void *)aArg);
        return SQLITE_NOMEM;
      }
      aArg = aNew;
      aArg[iArg++] = z;
      z[n] = '\0';
      sqlite3Fts3Dequote(z);
      z = &z[n+1];
    }
    rc = m->xCreate(iArg, aArg, ppTok);
    assert( rc!=SQLITE_OK || *ppTok );
    if( rc!=SQLITE_OK ){
      *pzErr = sqlite3_mprintf("unknown tokenizer");
    }else{
      (*ppTok)->pModule = m; 
    }
    sqlite3_free((void *)aArg);
  }

  sqlite3_free(zCopy);
  return rc;
}